

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportModuleDependencies
               (ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,
               ByteCode *moduleBytecode)

{
  int iVar1;
  ModuleData *this;
  Lexer *pLVar2;
  char *code;
  InplaceStr local_c8;
  InplaceStr local_b8;
  ModuleData *local_a8;
  ModuleData *moduleData;
  Lexeme *lexStream;
  ByteCode *pBStack_90;
  uint lexStreamSize;
  char *bytecode;
  ModuleData **local_78;
  ModuleData **uniqueModuleData;
  char *moduleFileName;
  ExternModuleInfo *moduleInfo;
  ExternModuleInfo *pEStack_58;
  uint i;
  ExternModuleInfo *moduleList;
  char *symbols;
  TraceScope traceScope;
  ByteCode *moduleBytecode_local;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)::token == '\0')
  {
    iVar1 = __cxa_guard_acquire(&ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)
                                 ::token);
    if (iVar1 != 0) {
      ImportModuleDependencies::token = NULLC::TraceGetToken("analyze","ImportModuleDependencies");
      __cxa_guard_release(&ImportModuleDependencies(ExpressionContext&,SynBase*,ModuleContext&,ByteCode*)
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&symbols,ImportModuleDependencies::token);
  moduleList = (ExternModuleInfo *)FindSymbols(moduleBytecode);
  pEStack_58 = FindFirstModule(moduleBytecode);
  for (moduleInfo._4_4_ = 0; moduleInfo._4_4_ < moduleBytecode->dependsCount;
      moduleInfo._4_4_ = moduleInfo._4_4_ + 1) {
    moduleFileName = (char *)(pEStack_58 + moduleInfo._4_4_);
    uniqueModuleData =
         (ModuleData **)
         ((long)&moduleList->nameHash + (ulong)((ExternModuleInfo *)moduleFileName)->nameOffset);
    InplaceStr::InplaceStr((InplaceStr *)&bytecode,(char *)uniqueModuleData);
    local_78 = SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find
                         (&ctx->uniqueDependencyMap,(InplaceStr *)&bytecode);
    if (local_78 == (ModuleData **)0x0) {
      pBStack_90 = (ByteCode *)BinaryCache::FindBytecode((char *)uniqueModuleData,false);
      if (pBStack_90 == (ByteCode *)0x0) {
        anon_unknown.dwarf_e7629::Stop
                  (ctx,source,"ERROR: module dependency import is not implemented");
      }
      lexStream._4_4_ = 0;
      moduleData = (ModuleData *)
                   BinaryCache::FindLexems
                             ((char *)uniqueModuleData,false,(uint *)((long)&lexStream + 4));
      this = ExpressionContext::get<ModuleData>(ctx);
      InplaceStr::InplaceStr(&local_b8,(char *)uniqueModuleData);
      ModuleData::ModuleData(this,source,local_b8);
      local_a8 = this;
      SmallArray<ModuleData_*,_32U>::push_back(&moduleCtx->dependencies,&local_a8);
      SmallArray<ModuleData_*,_128U>::push_back(&ctx->uniqueDependencies,&local_a8);
      InplaceStr::InplaceStr(&local_c8,(char *)uniqueModuleData);
      SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::insert
                (&ctx->uniqueDependencyMap,&local_c8,&local_a8);
      local_a8->bytecode = pBStack_90;
      if (moduleData == (ModuleData *)0x0) {
        pLVar2 = ExpressionContext::get<Lexer>(ctx);
        Lexer::Lexer(pLVar2,ctx->allocator);
        local_a8->lexer = pLVar2;
        pLVar2 = local_a8->lexer;
        code = FindSource(local_a8->bytecode);
        Lexer::Lexify(pLVar2,code);
        moduleData = (ModuleData *)Lexer::GetStreamStart(local_a8->lexer);
        lexStream._4_4_ = Lexer::GetStreamSize(local_a8->lexer);
        BinaryCache::PutLexemes((char *)uniqueModuleData,(Lexeme *)moduleData,lexStream._4_4_);
      }
      local_a8->lexStream = (Lexeme *)moduleData;
      local_a8->lexStreamSize = lexStream._4_4_;
    }
    else {
      SmallArray<ModuleData_*,_32U>::push_back(&moduleCtx->dependencies,local_78);
    }
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&symbols);
  return;
}

Assistant:

void ImportModuleDependencies(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, ByteCode *moduleBytecode)
{
	TRACE_SCOPE("analyze", "ImportModuleDependencies");

	char *symbols = FindSymbols(moduleBytecode);

	ExternModuleInfo *moduleList = FindFirstModule(moduleBytecode);

	for(unsigned i = 0; i < moduleBytecode->dependsCount; i++)
	{
		ExternModuleInfo &moduleInfo = moduleList[i];

		const char *moduleFileName = symbols + moduleInfo.nameOffset;

		if(ModuleData **uniqueModuleData = ctx.uniqueDependencyMap.find(InplaceStr(moduleFileName)))
		{
			moduleCtx.dependencies.push_back(*uniqueModuleData);
			continue;
		}

		const char *bytecode = BinaryCache::FindBytecode(moduleFileName, false);

		if(!bytecode)
			Stop(ctx, source, "ERROR: module dependency import is not implemented");

		unsigned lexStreamSize = 0;
		Lexeme *lexStream = BinaryCache::FindLexems(moduleFileName, false, lexStreamSize);

		ModuleData *moduleData = new (ctx.get<ModuleData>()) ModuleData(source, InplaceStr(moduleFileName));

		moduleCtx.dependencies.push_back(moduleData);

		ctx.uniqueDependencies.push_back(moduleData);
		ctx.uniqueDependencyMap.insert(InplaceStr(moduleFileName), moduleData);

		moduleData->bytecode = (ByteCode*)bytecode;

		if(!lexStream)
		{
			moduleData->lexer = new (ctx.get<Lexer>()) Lexer(ctx.allocator);

			moduleData->lexer->Lexify(FindSource(moduleData->bytecode));
			lexStream = moduleData->lexer->GetStreamStart();
			lexStreamSize = moduleData->lexer->GetStreamSize();

			BinaryCache::PutLexemes(moduleFileName, lexStream, lexStreamSize);
		}

		moduleData->lexStream = lexStream;
		moduleData->lexStreamSize = lexStreamSize;
	}
}